

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementTabSet.cpp
# Opt level: O1

void __thiscall Rml::ElementTabSet::SetPanel(ElementTabSet *this,int tab_index,String *rml)

{
  pointer *__ptr;
  ElementPtr element;
  Element *local_98;
  _Head_base<0UL,_Rml::Element_*,_false> local_90;
  String local_88;
  String local_68;
  XMLAttributes local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"*","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"panel","");
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement((Factory *)&local_98,(Element *)0x0,&local_68,&local_88,&local_48);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  Factory::InstanceElementText(local_98,rml);
  local_90._M_head_impl = local_98;
  local_98 = (Element *)0x0;
  SetPanel(this,tab_index,(ElementPtr *)&local_90);
  if (local_90._M_head_impl != (Element *)0x0) {
    (*((local_90._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
  }
  local_90._M_head_impl = (Element *)0x0;
  if (local_98 != (Element *)0x0) {
    (**(code **)(*(long *)local_98 + 0x10))();
  }
  return;
}

Assistant:

void ElementTabSet::SetPanel(int tab_index, const String& rml)
{
	ElementPtr element = Factory::InstanceElement(nullptr, "*", "panel", XMLAttributes());
	Factory::InstanceElementText(element.get(), rml);
	SetPanel(tab_index, std::move(element));
}